

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined4 uVar8;
  stbi__uint32 *psVar9;
  stbi__uint32 *psVar10;
  stbi_uc sVar11;
  byte bVar12;
  uchar uVar13;
  int iVar14;
  stbi__uint32 sVar15;
  uint uVar16;
  int iVar17;
  stbi__jpeg *psVar18;
  char *pcVar19;
  long lVar20;
  stbi__uint16 *data_00;
  uchar *data_01;
  void *pvVar21;
  code *pcVar22;
  stbi__context *psVar23;
  float *data_02;
  stbi_uc *psVar24;
  uchar *puVar25;
  byte *pbVar26;
  long lVar27;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar28;
  uint uVar29;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar30;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  undefined1 auVar31 [8];
  ulong uVar32;
  ulong uVar33;
  stbi_uc *psVar34;
  stbi_uc *psVar35;
  short *psVar36;
  undefined7 uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  undefined4 in_register_00000084;
  ulong uVar41;
  stbi__result_info *ri_00;
  ulong uVar42;
  int iVar43;
  int iVar44;
  stbi_uc (*pasVar45) [4];
  int *piVar46;
  stbi__context *psVar47;
  short sVar48;
  int iVar49;
  uint uVar50;
  long in_FS_OFFSET;
  bool bVar51;
  undefined1 auVar52 [16];
  stbi_uc *coutput [4];
  short data [64];
  uint local_8990;
  int local_8970;
  ulong local_8958;
  uint local_894c;
  uint local_8938;
  int local_892c;
  undefined1 local_8928 [8];
  undefined8 uStack_8920;
  undefined8 local_8918;
  undefined8 uStack_8910;
  int local_8908;
  stbi__uint32 *local_8900;
  stbi__uint32 *local_88f8;
  uint local_88ec;
  int *local_88e8;
  uint local_88dc;
  undefined8 local_88d8;
  undefined8 local_88d0;
  uint local_88c4;
  stbi_uc *local_88c0;
  ulong local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar34 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8900 = (stbi__uint32 *)x;
  local_88f8 = (stbi__uint32 *)y;
  local_88e8 = comp;
  psVar18 = (stbi__jpeg *)malloc(0x4888);
  psVar18->s = s;
  psVar18->idct_block_kernel = stbi__idct_simd;
  psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar18->jfif = 0;
  psVar18->app14_color_transform = -1;
  psVar18->marker = 0xff;
  sVar11 = stbi__get_marker(psVar18);
  if (sVar11 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar18);
  if (sVar11 == 0xd8) {
    psVar18 = (stbi__jpeg *)malloc(0x4888);
    psVar18->s = s;
    psVar18->idct_block_kernel = stbi__idct_simd;
    psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar18->img_comp;
      lVar20 = 0x46d8;
      do {
        psVar34 = psVar18->huff_dc[0].fast + lVar20 + -8;
        psVar34[0] = '\0';
        psVar34[1] = '\0';
        psVar34[2] = '\0';
        psVar34[3] = '\0';
        psVar34[4] = '\0';
        psVar34[5] = '\0';
        psVar34[6] = '\0';
        psVar34[7] = '\0';
        psVar34[8] = '\0';
        psVar34[9] = '\0';
        psVar34[10] = '\0';
        psVar34[0xb] = '\0';
        psVar34[0xc] = '\0';
        psVar34[0xd] = '\0';
        psVar34[0xe] = '\0';
        psVar34[0xf] = '\0';
        lVar20 = lVar20 + 0x60;
      } while (lVar20 != 0x4858);
      psVar18->restart_interval = 0;
      iVar14 = stbi__decode_jpeg_header(psVar18,0);
      uVar50 = extraout_EDX;
      if (iVar14 != 0) {
        bVar12 = stbi__get_marker(psVar18);
        local_88d8 = psVar18->huff_ac[0].delta + 9;
LAB_00158365:
        if (bVar12 == 0xda) {
          iVar14 = stbi__get16be(psVar18->s);
          psVar23 = psVar18->s;
          pbVar26 = psVar23->img_buffer;
          paVar30 = extraout_RDX_00;
          if (pbVar26 < psVar23->img_buffer_end) {
LAB_00158445:
            psVar23->img_buffer = pbVar26 + 1;
            bVar12 = *pbVar26;
          }
          else {
            if (psVar23->read_from_callbacks != 0) {
              psVar34 = psVar23->buffer_start;
              iVar44 = (*(psVar23->io).read)(psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
              if (iVar44 == 0) {
                psVar23->read_from_callbacks = 0;
                psVar23->img_buffer = psVar34;
                psVar23->img_buffer_end = psVar23->buffer_start + 1;
                psVar23->buffer_start[0] = '\0';
              }
              else {
                psVar23->img_buffer = psVar34;
                psVar23->img_buffer_end = psVar34 + iVar44;
              }
              pbVar26 = psVar23->img_buffer;
              paVar30 = extraout_RDX_01;
              goto LAB_00158445;
            }
            bVar12 = 0;
          }
          psVar18->scan_n = (uint)bVar12;
          if ((0xfb < (byte)(bVar12 - 5)) && ((int)(uint)bVar12 <= psVar18->s->img_n)) {
            if (iVar14 != (uint)bVar12 * 2 + 6) {
              pcVar19 = "bad SOS len";
              goto LAB_0015a91a;
            }
            if (bVar12 != 0) {
              lVar20 = 0;
              do {
                psVar23 = psVar18->s;
                pbVar26 = psVar23->img_buffer;
                if (pbVar26 < psVar23->img_buffer_end) {
LAB_00158500:
                  psVar23->img_buffer = pbVar26 + 1;
                  uVar28 = (uint)*pbVar26;
                }
                else {
                  if (psVar23->read_from_callbacks != 0) {
                    psVar34 = psVar23->buffer_start;
                    iVar14 = (*(psVar23->io).read)
                                       (psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
                    if (iVar14 == 0) {
                      psVar23->read_from_callbacks = 0;
                      psVar23->img_buffer = psVar34;
                      psVar23->img_buffer_end = psVar23->buffer_start + 1;
                      psVar23->buffer_start[0] = '\0';
                    }
                    else {
                      psVar23->img_buffer = psVar34;
                      psVar23->img_buffer_end = psVar34 + iVar14;
                    }
                    pbVar26 = psVar23->img_buffer;
                    goto LAB_00158500;
                  }
                  uVar28 = 0;
                }
                psVar23 = psVar18->s;
                pbVar26 = psVar23->img_buffer;
                if (pbVar26 < psVar23->img_buffer_end) {
LAB_0015857f:
                  psVar23->img_buffer = pbVar26 + 1;
                  bVar12 = *pbVar26;
                }
                else {
                  if (psVar23->read_from_callbacks != 0) {
                    psVar34 = psVar23->buffer_start;
                    iVar14 = (*(psVar23->io).read)
                                       (psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
                    if (iVar14 == 0) {
                      psVar23->read_from_callbacks = 0;
                      psVar23->img_buffer = psVar34;
                      psVar23->img_buffer_end = psVar23->buffer_start + 1;
                      psVar23->buffer_start[0] = '\0';
                    }
                    else {
                      psVar23->img_buffer = psVar34;
                      psVar23->img_buffer_end = psVar34 + iVar14;
                    }
                    pbVar26 = psVar23->img_buffer;
                    goto LAB_0015857f;
                  }
                  bVar12 = 0;
                }
                uVar50 = psVar18->s->img_n;
                if ((int)uVar50 < 1) {
                  uVar33 = 0;
                }
                else {
                  uVar33 = 0;
                  paVar30 = paVar1;
                  do {
                    if (paVar30->id == uVar28) goto LAB_001585b7;
                    uVar33 = uVar33 + 1;
                    paVar30 = paVar30 + 1;
                  } while (uVar50 != uVar33);
                  uVar33 = (ulong)uVar50;
                }
LAB_001585b7:
                if ((uint)uVar33 == uVar50) goto LAB_0015a923;
                uVar32 = uVar33 & 0xffffffff;
                paVar30 = (anon_struct_96_18_0d0905d3 *)(uVar32 * 0x60);
                psVar18->img_comp[uVar32].hd = (uint)(bVar12 >> 4);
                if (0x3f < bVar12) {
                  pcVar19 = "bad DC huff";
                  goto LAB_0015a91a;
                }
                paVar30 = paVar1 + uVar32;
                paVar30->ha = bVar12 & 0xf;
                if (3 < (bVar12 & 0xf)) {
                  pcVar19 = "bad AC huff";
                  goto LAB_0015a91a;
                }
                psVar18->order[lVar20] = (uint)uVar33;
                lVar20 = lVar20 + 1;
              } while (lVar20 < psVar18->scan_n);
            }
            psVar23 = psVar18->s;
            pbVar26 = psVar23->img_buffer;
            if (pbVar26 < psVar23->img_buffer_end) {
LAB_0015867d:
              psVar23->img_buffer = pbVar26 + 1;
              uVar50 = (uint)*pbVar26;
            }
            else {
              if (psVar23->read_from_callbacks != 0) {
                psVar34 = psVar23->buffer_start;
                iVar14 = (*(psVar23->io).read)
                                   (psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
                if (iVar14 == 0) {
                  psVar23->read_from_callbacks = 0;
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar23->buffer_start + 1;
                  psVar23->buffer_start[0] = '\0';
                }
                else {
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar34 + iVar14;
                }
                pbVar26 = psVar23->img_buffer;
                goto LAB_0015867d;
              }
              uVar50 = 0;
            }
            psVar18->spec_start = uVar50;
            psVar23 = psVar18->s;
            pbVar26 = psVar23->img_buffer;
            if (pbVar26 < psVar23->img_buffer_end) {
LAB_00158703:
              psVar23->img_buffer = pbVar26 + 1;
              uVar50 = (uint)*pbVar26;
            }
            else {
              if (psVar23->read_from_callbacks != 0) {
                psVar34 = psVar23->buffer_start;
                iVar14 = (*(psVar23->io).read)
                                   (psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
                if (iVar14 == 0) {
                  psVar23->read_from_callbacks = 0;
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar23->buffer_start + 1;
                  psVar23->buffer_start[0] = '\0';
                }
                else {
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar34 + iVar14;
                }
                pbVar26 = psVar23->img_buffer;
                goto LAB_00158703;
              }
              uVar50 = 0;
            }
            psVar18->spec_end = uVar50;
            psVar23 = psVar18->s;
            pbVar26 = psVar23->img_buffer;
            if (pbVar26 < psVar23->img_buffer_end) {
LAB_00158789:
              psVar23->img_buffer = pbVar26 + 1;
              bVar12 = *pbVar26;
            }
            else {
              if (psVar23->read_from_callbacks != 0) {
                psVar34 = psVar23->buffer_start;
                iVar14 = (*(psVar23->io).read)
                                   (psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
                if (iVar14 == 0) {
                  psVar23->read_from_callbacks = 0;
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar23->buffer_start + 1;
                  psVar23->buffer_start[0] = '\0';
                }
                else {
                  psVar23->img_buffer = psVar34;
                  psVar23->img_buffer_end = psVar34 + iVar14;
                }
                pbVar26 = psVar23->img_buffer;
                goto LAB_00158789;
              }
              bVar12 = 0;
            }
            psVar18->succ_high = (uint)(bVar12 >> 4);
            uVar50 = bVar12 & 0xf;
            paVar30 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar50;
            psVar18->succ_low = uVar50;
            iVar14 = psVar18->progressive;
            iVar44 = psVar18->spec_start;
            if (iVar14 == 0) {
              if (((iVar44 != 0) || (0xf < bVar12)) || ((bVar12 & 0xf) != 0)) goto LAB_00159e38;
              psVar18->spec_end = 0x3f;
            }
            else if (((0x3f < iVar44) || (0x3f < psVar18->spec_end)) ||
                    ((psVar18->spec_end < iVar44 || ((0xdf < bVar12 || (0xd < uVar50)))))) {
LAB_00159e38:
              pcVar19 = "bad SOS";
              goto LAB_0015a91a;
            }
            iVar44 = psVar18->scan_n;
            uVar33 = (ulong)(uint)psVar18->restart_interval;
            if (psVar18->restart_interval == 0) {
              uVar33 = 0x7fffffff;
            }
            psVar18->code_buffer = 0;
            psVar18->code_bits = 0;
            psVar18->nomore = 0;
            psVar18->img_comp[3].dc_pred = 0;
            psVar18->img_comp[2].dc_pred = 0;
            psVar18->img_comp[1].dc_pred = 0;
            psVar18->img_comp[0].dc_pred = 0;
            psVar18->marker = 0xff;
            uVar50 = (uint)uVar33;
            psVar18->todo = uVar50;
            psVar18->eob_run = 0;
            if (iVar14 == 0) {
              if (iVar44 == 1) {
                iVar44 = psVar18->order[0];
                uVar28 = psVar18->img_comp[iVar44].y + 7 >> 3;
                local_8958 = (ulong)uVar28;
                if (0 < (int)uVar28) {
                  uVar16 = paVar1[iVar44].x + 7 >> 3;
                  iVar43 = 0;
                  uVar29 = 0;
                  iVar14 = local_8970;
                  do {
                    if (0 < (int)uVar16) {
                      lVar20 = 0;
                      do {
                        iVar39 = stbi__jpeg_decode_block
                                           (psVar18,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar18->huff_dc[paVar1[iVar44].hd].fast,
                                            (stbi__huffman *)
                                            psVar18->huff_ac[paVar1[iVar44].ha].fast,
                                            psVar18->fast_ac[paVar1[iVar44].ha],iVar44,
                                            psVar18->dequant[paVar1[iVar44].tq]);
                        if (iVar39 == 0) {
                          bVar51 = false;
                          iVar14 = 0;
                          uVar33 = extraout_RDX_07;
                        }
                        else {
                          (*psVar18->idct_block_kernel)
                                    (paVar1[iVar44].data + lVar20 + iVar43 * paVar1[iVar44].w2,
                                     paVar1[iVar44].w2,(short *)&local_88a8);
                          iVar39 = psVar18->todo;
                          psVar18->todo = iVar39 + -1;
                          bVar51 = true;
                          uVar33 = extraout_RDX_08;
                          if (iVar39 < 2) {
                            if (psVar18->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar18);
                              uVar33 = extraout_RDX_09;
                            }
                            if ((psVar18->marker & 0xf8) == 0xd0) {
                              psVar18->code_buffer = 0;
                              psVar18->code_bits = 0;
                              psVar18->nomore = 0;
                              psVar18->img_comp[3].dc_pred = 0;
                              psVar18->img_comp[2].dc_pred = 0;
                              psVar18->img_comp[1].dc_pred = 0;
                              psVar18->img_comp[0].dc_pred = 0;
                              psVar18->marker = 0xff;
                              iVar39 = psVar18->restart_interval;
                              uVar33 = 0x7fffffff;
                              if (iVar39 == 0) {
                                iVar39 = 0x7fffffff;
                              }
                              psVar18->todo = iVar39;
                              psVar18->eob_run = 0;
                            }
                            else {
                              iVar14 = 1;
                              bVar51 = false;
                            }
                          }
                        }
                        uVar50 = (uint)uVar33;
                        local_8970 = iVar14;
                        if (!bVar51) goto LAB_00159806;
                        lVar20 = lVar20 + 8;
                      } while ((ulong)uVar16 * 8 != lVar20);
                    }
                    uVar50 = (uint)uVar33;
                    uVar29 = uVar29 + 1;
                    iVar43 = iVar43 + 8;
                    local_8970 = iVar14;
                  } while (uVar29 != uVar28);
                }
LAB_00159597:
                iVar14 = 1;
              }
              else {
                iVar14 = 1;
                if (0 < psVar18->img_mcu_y) {
                  iVar44 = 0;
                  do {
                    if (0 < psVar18->img_mcu_x) {
                      local_8970 = 0;
                      do {
                        if (0 < psVar18->scan_n) {
                          uVar32 = 0;
                          do {
                            local_8958 = uVar32;
                            iVar14 = psVar18->order[local_8958];
                            if (0 < psVar18->img_comp[iVar14].v) {
                              iVar43 = 0;
                              bVar51 = true;
                              do {
                                iVar39 = paVar1[iVar14].h;
                                if (0 < iVar39) {
                                  iVar40 = 0;
                                  do {
                                    iVar49 = paVar1[iVar14].v;
                                    iVar17 = stbi__jpeg_decode_block
                                                       (psVar18,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar18->huff_dc[paVar1[iVar14].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar18->huff_ac[paVar1[iVar14].ha].fast,
                                                        psVar18->fast_ac[paVar1[iVar14].ha],iVar14,
                                                        psVar18->dequant[paVar1[iVar14].tq]);
                                    uVar50 = (uint)extraout_RDX_11;
                                    if (iVar17 == 0) {
                                      uVar33 = extraout_RDX_11;
                                      if (bVar51) goto LAB_001597ee;
                                      goto LAB_001596fb;
                                    }
                                    (*psVar18->idct_block_kernel)
                                              (paVar1[iVar14].data +
                                               (long)((iVar39 * local_8970 + iVar40) * 8) +
                                               (long)((iVar49 * iVar44 + iVar43) * paVar1[iVar14].w2
                                                     * 8),paVar1[iVar14].w2,(short *)&local_88a8);
                                    iVar40 = iVar40 + 1;
                                    iVar39 = paVar1[iVar14].h;
                                    uVar33 = extraout_RDX_12;
                                  } while (iVar40 < iVar39);
                                }
                                iVar43 = iVar43 + 1;
                                bVar51 = iVar43 < paVar1[iVar14].v;
                              } while (iVar43 < paVar1[iVar14].v);
                            }
LAB_001596fb:
                            uVar32 = local_8958 + 1;
                          } while ((long)(local_8958 + 1) < (long)psVar18->scan_n);
                        }
                        uVar50 = (uint)uVar33;
                        iVar43 = psVar18->todo;
                        psVar18->todo = iVar43 + -1;
                        iVar14 = 1;
                        if (iVar43 < 2) {
                          if (psVar18->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar18);
                            uVar50 = extraout_EDX_02;
                          }
                          if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_00159806;
                          psVar18->code_buffer = 0;
                          psVar18->code_bits = 0;
                          psVar18->nomore = 0;
                          psVar18->img_comp[3].dc_pred = 0;
                          psVar18->img_comp[2].dc_pred = 0;
                          psVar18->img_comp[1].dc_pred = 0;
                          psVar18->img_comp[0].dc_pred = 0;
                          psVar18->marker = 0xff;
                          iVar14 = psVar18->restart_interval;
                          uVar33 = 0x7fffffff;
                          if (iVar14 == 0) {
                            iVar14 = 0x7fffffff;
                          }
                          psVar18->todo = iVar14;
                          psVar18->eob_run = 0;
                        }
                        local_8970 = local_8970 + 1;
                      } while (local_8970 < psVar18->img_mcu_x);
                    }
                    uVar50 = (uint)uVar33;
                    iVar14 = 1;
                    iVar44 = iVar44 + 1;
                  } while (iVar44 < psVar18->img_mcu_y);
                }
              }
            }
            else if (iVar44 == 1) {
              local_88b8 = (ulong)psVar18->order[0];
              local_88ec = psVar18->img_comp[local_88b8].y + 7 >> 3;
              iVar14 = 1;
              if (0 < (int)local_88ec) {
                paVar30 = paVar1 + local_88b8;
                iVar44 = psVar18->img_comp[local_88b8].x + 7 >> 3;
                local_894c = 0;
                local_88d0 = paVar30;
                do {
                  if (0 < iVar44) {
                    iVar14 = 0;
                    do {
                      piVar46 = local_88d8;
                      psVar36 = paVar30->coeff +
                                (int)((paVar30->coeff_w * local_894c + iVar14) * 0x40);
                      uVar32 = (ulong)psVar18->spec_start;
                      if (uVar32 == 0) {
                        iVar43 = stbi__jpeg_decode_block_prog_dc
                                           (psVar18,psVar36,
                                            (stbi__huffman *)psVar18->huff_dc[paVar30->hd].fast,
                                            (int)local_88b8);
                        uVar33 = extraout_RDX_03;
                        if (iVar43 != 0) goto LAB_00158de6;
                        bVar51 = false;
                        local_8958 = 0;
                      }
                      else {
                        lVar20 = (long)paVar30->ha;
                        local_8970 = psVar18->succ_low;
                        iVar43 = psVar18->eob_run;
                        bVar12 = (byte)local_8970;
                        if (psVar18->succ_high == 0) {
                          if (iVar43 == 0) {
                            do {
                              if (psVar18->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar18);
                              }
                              sVar48 = psVar18->fast_ac[lVar20][psVar18->code_buffer >> 0x17];
                              uVar50 = (uint)sVar48;
                              iVar43 = (int)uVar32;
                              if (sVar48 == 0) {
                                if (psVar18->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar18);
                                }
                                uVar50 = psVar18->code_buffer;
                                uVar42 = (ulong)uVar50;
                                uVar33 = (ulong)psVar18->huff_ac[lVar20].fast[uVar50 >> 0x17];
                                if (uVar33 == 0xff) {
                                  lVar27 = 0;
                                  do {
                                    lVar38 = lVar27;
                                    lVar27 = lVar38 + 1;
                                  } while ((uint)piVar46[lVar20 * 0x1a4 + lVar38 + -0x11] <=
                                           uVar50 >> 0x10);
                                  iVar39 = psVar18->code_bits;
                                  if (lVar27 == 8) {
                                    psVar18->code_bits = iVar39 + -0x10;
                                    uVar41 = 0xffffffff;
                                  }
                                  else {
                                    uVar41 = 0xffffffff;
                                    if ((int)(lVar38 + 10) <= iVar39) {
                                      iVar40 = (uVar50 >> (0x17U - (char)lVar27 & 0x1f) &
                                               stbi__bmask[lVar38 + 10]) +
                                               piVar46[lVar20 * 0x1a4 + lVar27];
                                      bVar2 = psVar18->huff_ac[lVar20].size[iVar40];
                                      if ((uVar50 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                          (uint)psVar18->huff_ac[lVar20].code[iVar40])
                                      goto LAB_0015b8b6;
                                      uVar50 = uVar50 << ((byte)(lVar38 + 10) & 0x1f);
                                      uVar42 = (ulong)uVar50;
                                      psVar18->code_bits = (iVar39 - (int)lVar27) + -9;
                                      psVar18->code_buffer = uVar50;
                                      uVar41 = (ulong)psVar18->huff_ac[lVar20].values[iVar40];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar18->huff_ac[lVar20].size[uVar33];
                                  uVar41 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                    uVar50 = uVar50 << (bVar2 & 0x1f);
                                    uVar42 = (ulong)uVar50;
                                    psVar18->code_buffer = uVar50;
                                    psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                    uVar41 = (ulong)psVar18->huff_ac[lVar20].values[uVar33];
                                  }
                                }
                                uVar50 = (uint)uVar41;
                                if ((int)uVar50 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                  iVar43 = 1;
                                  uVar33 = 0;
                                }
                                else {
                                  uVar33 = uVar41 >> 4;
                                  uVar28 = uVar50 & 0xf;
                                  if ((uVar41 & 0xf) == 0) {
                                    if (uVar50 < 0xf0) {
                                      psVar18->eob_run = 1 << ((byte)uVar33 & 0x1f);
                                      if (0xf < uVar50) {
                                        if (psVar18->code_bits < (int)uVar33) {
                                          stbi__grow_buffer_unsafe(psVar18);
                                        }
                                        bVar2 = (byte)uVar33 & 0x1f;
                                        uVar28 = psVar18->code_buffer << bVar2 |
                                                 psVar18->code_buffer >> 0x20 - bVar2;
                                        uVar50 = stbi__bmask[uVar33];
                                        psVar18->code_buffer = ~uVar50 & uVar28;
                                        psVar18->code_bits = psVar18->code_bits - (int)uVar33;
                                        psVar18->eob_run = psVar18->eob_run + (uVar28 & uVar50);
                                      }
                                      psVar18->eob_run = psVar18->eob_run + -1;
                                      iVar43 = 2;
                                      uVar33 = 0;
                                      goto LAB_001591d9;
                                    }
                                    uVar50 = iVar43 + 0x10;
                                  }
                                  else {
                                    bVar2 = ""[(long)iVar43 + uVar33];
                                    if (psVar18->code_bits < (int)uVar28) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                    }
                                    uVar50 = psVar18->code_buffer;
                                    uVar29 = uVar50 << (sbyte)uVar28 |
                                             uVar50 >> 0x20 - (sbyte)uVar28;
                                    uVar16 = *(uint *)((long)stbi__bmask + (ulong)(uVar28 * 4));
                                    psVar18->code_buffer = ~uVar16 & uVar29;
                                    psVar18->code_bits = psVar18->code_bits - uVar28;
                                    iVar39 = 0;
                                    if (-1 < (int)uVar50) {
                                      iVar39 = *(int *)((long)stbi__jbias + (ulong)(uVar28 * 4));
                                    }
                                    uVar28 = (uVar29 & uVar16) + iVar39 << (bVar12 & 0x1f);
                                    uVar42 = (ulong)uVar28;
                                    uVar50 = (int)((long)iVar43 + uVar33) + 1;
                                    psVar36[bVar2] = (short)uVar28;
                                  }
                                  iVar43 = 0;
                                  uVar32 = (ulong)uVar50;
                                  uVar33 = CONCAT71((int7)(uVar42 >> 8),1);
                                }
                              }
                              else {
                                psVar18->code_buffer = psVar18->code_buffer << (sbyte)(uVar50 & 0xf)
                                ;
                                psVar18->code_bits = psVar18->code_bits - (uVar50 & 0xf);
                                lVar27 = (long)iVar43 + (ulong)(uVar50 >> 4 & 0xf);
                                uVar32 = (ulong)((int)lVar27 + 1);
                                psVar36[""[lVar27]] = (short)((uVar50 >> 8) << (bVar12 & 0x1f));
                                iVar43 = 0 << (bVar12 & 0x1f);
                                uVar33 = 1;
                              }
LAB_001591d9:
                              bVar51 = false;
                              uVar42 = 1;
                              if (iVar43 != 0) {
                                if (iVar43 != 2) {
                                  uVar42 = uVar33;
                                }
                                break;
                              }
                            } while ((int)uVar32 <= psVar18->spec_end);
                          }
                          else {
                            psVar18->eob_run = iVar43 + -1;
                            bVar51 = true;
                            uVar42 = 0;
                          }
                          if ((char)uVar42 != '\0') goto LAB_00158dbc;
                        }
                        else {
                          if (iVar43 == 0) {
                            uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                            do {
                              if (psVar18->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar18);
                              }
                              uVar28 = psVar18->code_buffer;
                              uVar33 = (ulong)uVar28;
                              uVar42 = (ulong)psVar18->huff_ac[lVar20].fast[uVar28 >> 0x17];
                              if (uVar42 == 0xff) {
                                lVar27 = 0;
                                do {
                                  lVar38 = lVar27;
                                  lVar27 = lVar38 + 1;
                                } while ((uint)piVar46[lVar20 * 0x1a4 + lVar38 + -0x11] <=
                                         uVar28 >> 0x10);
                                iVar43 = psVar18->code_bits;
                                if (lVar27 == 8) {
                                  psVar18->code_bits = iVar43 + -0x10;
                                  uVar41 = 0xffffffff;
                                }
                                else {
                                  uVar41 = 0xffffffff;
                                  if ((int)(lVar38 + 10) <= iVar43) {
                                    iVar39 = (uVar28 >> (0x17U - (char)lVar27 & 0x1f) &
                                             stbi__bmask[lVar38 + 10]) +
                                             piVar46[lVar20 * 0x1a4 + lVar27];
                                    bVar2 = psVar18->huff_ac[lVar20].size[iVar39];
                                    if ((uVar28 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)psVar18->huff_ac[lVar20].code[iVar39]) {
LAB_0015b8b6:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                                                  ,0x801,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar28 = uVar28 << ((byte)(lVar38 + 10) & 0x1f);
                                    uVar33 = (ulong)uVar28;
                                    psVar18->code_bits = (iVar43 - (int)lVar27) + -9;
                                    psVar18->code_buffer = uVar28;
                                    uVar41 = (ulong)psVar18->huff_ac[lVar20].values[iVar39];
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar18->huff_ac[lVar20].size[uVar42];
                                uVar41 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                  uVar28 = uVar28 << (bVar2 & 0x1f);
                                  uVar33 = (ulong)uVar28;
                                  psVar18->code_buffer = uVar28;
                                  psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                  uVar41 = (ulong)psVar18->huff_ac[lVar20].values[uVar42];
                                }
                              }
                              uVar28 = (uint)uVar41;
                              if ((int)uVar28 < 0) {
                                *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                bVar51 = false;
                              }
                              else {
                                uVar42 = uVar41 >> 4;
                                if ((uVar28 & 0xf) == 1) {
                                  if (psVar18->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar18);
                                    uVar33 = extraout_RDX_04;
                                  }
                                  uVar28 = psVar18->code_buffer;
                                  psVar18->code_buffer = uVar28 * 2;
                                  psVar18->code_bits = psVar18->code_bits + -1;
                                  sVar48 = (short)(((int)~uVar28 >> 0x1f | 1U) << (bVar12 & 0x1f));
                                }
                                else {
                                  if ((uVar41 & 0xf) != 0) {
                                    *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                    bVar51 = false;
                                    goto LAB_00158da7;
                                  }
                                  if (uVar28 < 0xf0) {
                                    psVar18->eob_run = ~(-1 << ((byte)uVar42 & 0x1f));
                                    if (0xf < uVar28) {
                                      if (psVar18->code_bits < (int)uVar42) {
                                        stbi__grow_buffer_unsafe(psVar18);
                                      }
                                      bVar2 = (byte)uVar42 & 0x1f;
                                      uVar16 = psVar18->code_buffer << bVar2 |
                                               psVar18->code_buffer >> 0x20 - bVar2;
                                      uVar28 = stbi__bmask[uVar42];
                                      uVar29 = ~uVar28 & uVar16;
                                      uVar33 = (ulong)uVar29;
                                      psVar18->code_buffer = uVar29;
                                      psVar18->code_bits = psVar18->code_bits - (int)uVar42;
                                      psVar18->eob_run = psVar18->eob_run + (uVar16 & uVar28);
                                    }
                                    sVar48 = 0;
                                    uVar42 = 0x40;
                                  }
                                  else {
                                    sVar48 = 0;
                                    uVar42 = 0xf;
                                  }
                                }
                                uVar32 = (ulong)(int)uVar32;
                                do {
                                  if ((long)psVar18->spec_end < (long)uVar32) break;
                                  bVar2 = ""[uVar32];
                                  if (psVar36[bVar2] == 0) {
                                    if ((int)uVar42 == 0) {
                                      psVar36[bVar2] = sVar48;
                                      bVar51 = false;
                                      uVar42 = 0;
                                    }
                                    else {
                                      uVar42 = (ulong)((int)uVar42 - 1);
                                      bVar51 = true;
                                    }
                                  }
                                  else {
                                    if (psVar18->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                      uVar33 = extraout_RDX_05;
                                    }
                                    sVar15 = psVar18->code_buffer;
                                    psVar18->code_buffer = sVar15 * 2;
                                    psVar18->code_bits = psVar18->code_bits + -1;
                                    bVar51 = true;
                                    if (((int)sVar15 < 0) &&
                                       (sVar3 = psVar36[bVar2], (uVar50 & (int)sVar3) == 0)) {
                                      uVar28 = uVar50;
                                      if (sVar3 < 1) {
                                        uVar28 = -uVar50;
                                      }
                                      psVar36[bVar2] = sVar3 + (short)uVar28;
                                    }
                                  }
                                  uVar32 = uVar32 + 1;
                                } while (bVar51);
                                bVar51 = true;
                              }
LAB_00158da7:
                              if (!bVar51) {
                                bVar51 = false;
                                goto LAB_00158dc1;
                              }
                            } while ((int)uVar32 <= psVar18->spec_end);
                          }
                          else {
                            psVar18->eob_run = iVar43 + -1;
                            if (psVar18->spec_start <= psVar18->spec_end) {
                              uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                              do {
                                bVar12 = ""[uVar32];
                                if (psVar36[bVar12] != 0) {
                                  if (psVar18->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar18);
                                    uVar33 = extraout_RDX_02;
                                  }
                                  sVar15 = psVar18->code_buffer;
                                  psVar18->code_buffer = sVar15 * 2;
                                  psVar18->code_bits = psVar18->code_bits + -1;
                                  if (((int)sVar15 < 0) &&
                                     (sVar48 = psVar36[bVar12], (uVar50 & (int)sVar48) == 0)) {
                                    uVar28 = -uVar50;
                                    if (0 < sVar48) {
                                      uVar28 = uVar50;
                                    }
                                    psVar36[bVar12] = (short)uVar28 + sVar48;
                                  }
                                }
                                bVar51 = (long)uVar32 < (long)psVar18->spec_end;
                                uVar32 = uVar32 + 1;
                              } while (bVar51);
                            }
                          }
LAB_00158dbc:
                          bVar51 = true;
                        }
LAB_00158dc1:
                        if (!bVar51) {
                          local_8958._0_4_ = 0;
                        }
                        local_8958 = (ulong)(uint)local_8958;
                        paVar30 = local_88d0;
                        if (!bVar51) {
                          bVar51 = false;
                        }
                        else {
LAB_00158de6:
                          iVar43 = psVar18->todo;
                          psVar18->todo = iVar43 + -1;
                          bVar51 = true;
                          if (iVar43 < 2) {
                            if (psVar18->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar18);
                              uVar33 = extraout_RDX_06;
                            }
                            if ((psVar18->marker & 0xf8) == 0xd0) {
                              psVar18->code_buffer = 0;
                              psVar18->code_bits = 0;
                              psVar18->nomore = 0;
                              psVar18->img_comp[3].dc_pred = 0;
                              psVar18->img_comp[2].dc_pred = 0;
                              psVar18->img_comp[1].dc_pred = 0;
                              psVar18->img_comp[0].dc_pred = 0;
                              psVar18->marker = 0xff;
                              iVar43 = psVar18->restart_interval;
                              uVar33 = 0x7fffffff;
                              if (iVar43 == 0) {
                                iVar43 = 0x7fffffff;
                              }
                              psVar18->todo = iVar43;
                              psVar18->eob_run = 0;
                            }
                            else {
                              local_8958 = 1;
                              bVar51 = false;
                            }
                          }
                        }
                      }
                      uVar50 = (uint)uVar33;
                      if (!bVar51) {
                        iVar14 = (int)local_8958;
                        goto LAB_00159806;
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != iVar44);
                  }
                  uVar50 = (uint)uVar33;
                  iVar14 = 1;
                  local_894c = local_894c + 1;
                } while (local_894c != local_88ec);
              }
            }
            else {
              iVar14 = 1;
              if (0 < psVar18->img_mcu_y) {
                iVar14 = 0;
                do {
                  if (0 < psVar18->img_mcu_x) {
                    iVar44 = 0;
                    do {
                      if (0 < psVar18->scan_n) {
                        lVar20 = 0;
                        do {
                          iVar43 = psVar18->order[lVar20];
                          if (0 < psVar18->img_comp[iVar43].v) {
                            iVar39 = 0;
                            bVar51 = true;
                            do {
                              iVar40 = paVar1[iVar43].h;
                              if (0 < iVar40) {
                                iVar49 = 0;
                                do {
                                  iVar40 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar18,paVar1[iVar43].coeff +
                                                              (iVar40 * iVar44 + iVar49 +
                                                              (paVar1[iVar43].v * iVar14 + iVar39) *
                                                              paVar1[iVar43].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar18->huff_dc[paVar1[iVar43].hd].fast,
                                                      iVar43);
                                  uVar50 = (uint)extraout_RDX_10;
                                  uVar33 = extraout_RDX_10;
                                  if (iVar40 == 0) {
                                    if (bVar51) goto LAB_001597ee;
                                    goto LAB_001594ca;
                                  }
                                  iVar49 = iVar49 + 1;
                                  iVar40 = paVar1[iVar43].h;
                                } while (iVar49 < iVar40);
                              }
                              iVar39 = iVar39 + 1;
                              bVar51 = iVar39 < paVar1[iVar43].v;
                            } while (iVar39 < paVar1[iVar43].v);
                          }
LAB_001594ca:
                          lVar20 = lVar20 + 1;
                        } while (lVar20 < psVar18->scan_n);
                      }
                      uVar50 = (uint)uVar33;
                      iVar43 = psVar18->todo;
                      psVar18->todo = iVar43 + -1;
                      if (iVar43 < 2) {
                        if (psVar18->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar18);
                          uVar50 = extraout_EDX_01;
                        }
                        if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_00159597;
                        psVar18->code_buffer = 0;
                        psVar18->code_bits = 0;
                        psVar18->nomore = 0;
                        psVar18->img_comp[3].dc_pred = 0;
                        psVar18->img_comp[2].dc_pred = 0;
                        psVar18->img_comp[1].dc_pred = 0;
                        psVar18->img_comp[0].dc_pred = 0;
                        psVar18->marker = 0xff;
                        iVar43 = psVar18->restart_interval;
                        uVar33 = 0x7fffffff;
                        if (iVar43 == 0) {
                          iVar43 = 0x7fffffff;
                        }
                        psVar18->todo = iVar43;
                        psVar18->eob_run = 0;
                      }
                      iVar44 = iVar44 + 1;
                    } while (iVar44 < psVar18->img_mcu_x);
                  }
                  uVar50 = (uint)uVar33;
                  iVar14 = iVar14 + 1;
                } while (iVar14 < psVar18->img_mcu_y);
                goto LAB_00159597;
              }
            }
            goto LAB_00159806;
          }
          pcVar19 = "bad SOS component count";
LAB_0015a91a:
          uVar50 = (uint)paVar30;
          *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
        }
        else {
          if (bVar12 == 0xdc) {
            iVar14 = stbi__get16be(psVar18->s);
            sVar15 = stbi__get16be(psVar18->s);
            paVar30 = extraout_RDX;
            if (iVar14 == 4) {
              if (sVar15 == psVar18->s->img_y) goto LAB_00159818;
              pcVar19 = "bad DNL height";
            }
            else {
              pcVar19 = "bad DNL len";
            }
            goto LAB_0015a91a;
          }
          if (bVar12 == 0xd9) {
            if ((psVar18->progressive != 0) && (0 < psVar18->s->img_n)) {
              lVar20 = 0;
              do {
                iVar14 = psVar18->img_comp[lVar20].y + 7 >> 3;
                if (0 < iVar14) {
                  uVar50 = paVar1[lVar20].x + 7 >> 3;
                  iVar44 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      uVar33 = 0;
                      do {
                        psVar36 = paVar1[lVar20].coeff +
                                  (paVar1[lVar20].coeff_w * iVar44 + (int)uVar33) * 0x40;
                        iVar43 = paVar1[lVar20].tq;
                        lVar27 = 0;
                        do {
                          psVar36[lVar27] = psVar36[lVar27] * psVar18->dequant[iVar43][lVar27];
                          lVar27 = lVar27 + 1;
                        } while (lVar27 != 0x40);
                        (*psVar18->idct_block_kernel)
                                  (paVar1[lVar20].data +
                                   uVar33 * 8 + (long)(iVar44 * 8 * paVar1[lVar20].w2),
                                   paVar1[lVar20].w2,psVar36);
                        uVar33 = uVar33 + 1;
                      } while (uVar33 != uVar50);
                    }
                    iVar44 = iVar44 + 1;
                  } while (iVar44 != iVar14);
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < psVar18->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar18->s->img_n) * 2 + 1;
            }
            uVar50 = psVar18->s->img_n;
            if (uVar50 == 3) {
              bVar51 = true;
              if (psVar18->rgb != 3) {
                if (psVar18->app14_color_transform != 0) goto LAB_0015a0a1;
                bVar51 = psVar18->jfif == 0;
              }
            }
            else {
LAB_0015a0a1:
              bVar51 = false;
            }
            uVar28 = 1;
            if (bVar51) {
              uVar28 = uVar50;
            }
            if (2 < req_comp) {
              uVar28 = uVar50;
            }
            if (uVar50 != 3) {
              uVar28 = uVar50;
            }
            local_8918 = (stbi_uc *)0x0;
            uStack_8910 = (stbi_uc *)0x0;
            local_8928 = (undefined1  [8])0x0;
            uStack_8920 = (stbi_uc *)0x0;
            if (0 < (int)uVar28) {
              lVar20 = 0;
              while( true ) {
                psVar23 = psVar18->s;
                sVar15 = psVar23->img_x;
                pvVar21 = malloc((ulong)(sVar15 + 3));
                *(void **)((long)&psVar18->img_comp[0].linebuf + lVar20 * 2) = pvVar21;
                if (pvVar21 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar18,psVar23->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                }
                else {
                  uVar33 = (long)psVar18->img_h_max /
                           (long)*(int *)((long)&psVar18->img_comp[0].h + lVar20 * 2);
                  iVar14 = (int)uVar33;
                  *(int *)((long)(local_88a8.pal + -7) + lVar20) = iVar14;
                  iVar44 = psVar18->img_v_max / *(int *)((long)&psVar18->img_comp[0].v + lVar20 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar20) = iVar44;
                  *(int *)((long)(local_88a8.pal + -4) + lVar20) = iVar44 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar20) =
                       (int)((ulong)((sVar15 + iVar14) - 1) / (uVar33 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar20) = 0;
                  uVar7 = *(undefined8 *)((long)&psVar18->img_comp[0].data + lVar20 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar20) = uVar7;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar20) = uVar7;
                  if ((iVar14 == 1) && (iVar44 == 1)) {
                    pcVar22 = resample_row_1;
                  }
                  else if ((iVar14 == 1) && (iVar44 == 2)) {
                    pcVar22 = stbi__resample_row_v_2;
                  }
                  else if ((iVar14 == 2) && (iVar44 == 1)) {
                    pcVar22 = stbi__resample_row_h_2;
                  }
                  else if ((iVar14 == 2) && (iVar44 == 2)) {
                    pcVar22 = psVar18->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar22 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar20) = pcVar22;
                }
                if (pvVar21 == (void *)0x0) break;
                lVar20 = lVar20 + 0x30;
                if ((ulong)uVar28 * 0x30 == lVar20) goto LAB_0015a212;
              }
              goto LAB_0015a932;
            }
LAB_0015a212:
            psVar47 = psVar18->s;
            sVar15 = psVar47->img_y;
            psVar23 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar47->img_x,sVar15,1);
            iVar14 = (int)extraout_RDX_13;
            if (psVar23 == (stbi__context *)0x0) {
              stbi__free_jpeg_components(psVar18,psVar47->img_n,iVar14);
              pcVar19 = "outofmem";
              goto LAB_00158273;
            }
            if (sVar15 != 0) {
              iVar44 = 0;
              uVar50 = 0;
              auVar31 = (undefined1  [8])extraout_RDX_13;
              do {
                sVar15 = psVar47->img_x;
                if (0 < (int)uVar28) {
                  pasVar45 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar33 = 0;
                  piVar46 = &psVar18->img_comp[0].y;
                  do {
                    asVar5 = pasVar45[-1];
                    asVar6 = pasVar45[-3];
                    iVar14 = (int)asVar6 >> 1;
                    auVar52 = (**(code **)(pasVar45 + -10))
                                        (*(stbi_uc **)(piVar46 + 10),
                                         *(undefined8 *)
                                          (*pasVar45 +
                                          ((ulong)(iVar14 <= (int)asVar5) << 3 | 0xffffffffffffffe0)
                                          ),*(undefined8 *)
                                             (*pasVar45 +
                                             ((ulong)((int)asVar5 < iVar14) << 3 |
                                             0xffffffffffffffe0)),pasVar45[-2]);
                    auVar31 = auVar52._8_8_;
                    *(long *)(local_8928 + uVar33 * 8) = auVar52._0_8_;
                    pasVar45[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar45[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar45 + -8) = *(stbi_uc **)(pasVar45 + -6);
                      asVar5 = *pasVar45;
                      *pasVar45 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar46) {
                        *(stbi_uc **)(pasVar45 + -6) = *(stbi_uc **)(pasVar45 + -6) + piVar46[1];
                      }
                    }
                    uVar33 = uVar33 + 1;
                    piVar46 = piVar46 + 0x18;
                    pasVar45 = pasVar45 + 0xc;
                  } while (uVar28 != uVar33);
                }
                if (req_comp < 3) {
                  psVar47 = psVar18->s;
                  if (bVar51) {
                    if (req_comp == 1) {
                      if (psVar47->img_x != 0) {
                        uVar33 = 0;
                        do {
                          bVar12 = local_8918[uVar33];
                          psVar23->buffer_start[uVar33 + sVar15 * iVar44 + -0x38] =
                               (stbi_uc)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                         (uint)uStack_8920[uVar33] * 0x96 +
                                         (uint)*(byte *)((long)local_8928 + uVar33) * 0x4d >> 8);
                          uVar33 = uVar33 + 1;
                          auVar31 = (undefined1  [8])uStack_8920;
                        } while (uVar33 < psVar47->img_x);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar33 = 0;
                      do {
                        bVar12 = local_8918[uVar33];
                        psVar23->buffer_start[uVar33 * 2 + (ulong)(sVar15 * iVar44) + -0x38] =
                             (stbi_uc)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                       (uint)uStack_8920[uVar33] * 0x96 +
                                       (uint)*(byte *)((long)local_8928 + uVar33) * 0x4d >> 8);
                        psVar23->buffer_start[uVar33 * 2 + (ulong)(sVar15 * iVar44) + -0x37] = 0xff;
                        uVar33 = uVar33 + 1;
                        auVar31 = (undefined1  [8])uStack_8920;
                      } while (uVar33 < psVar47->img_x);
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar18->app14_color_transform == 2) {
                      if (psVar47->img_x != 0) {
                        psVar34 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x37);
                        uVar33 = 0;
                        do {
                          iVar14 = (*(byte *)((long)local_8928 + uVar33) ^ 0xff) *
                                   (uint)uStack_8910[uVar33];
                          psVar34[-1] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          *psVar34 = 0xff;
                          uVar33 = uVar33 + 1;
                          psVar34 = psVar34 + (uint)req_comp;
                          auVar31 = (undefined1  [8])uStack_8910;
                        } while (uVar33 < psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar18->app14_color_transform != 0) goto LAB_0015a657;
                      if (psVar47->img_x != 0) {
                        psVar34 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x37);
                        uVar33 = 0;
                        do {
                          bVar12 = uStack_8910[uVar33];
                          iVar14 = (uint)*(byte *)((long)local_8928 + uVar33) * (uint)bVar12;
                          iVar43 = (uint)uStack_8920[uVar33] * (uint)bVar12;
                          psVar34[-1] = (char)(((uint)local_8918[uVar33] * (uint)bVar12 +
                                                ((uint)local_8918[uVar33] * (uint)bVar12 + 0x80 >> 8
                                                ) + 0x80 >> 8 & 0xff) * 0x1d +
                                               (iVar43 + (iVar43 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                               0x96 + (iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x4d >> 8);
                          *psVar34 = 0xff;
                          uVar33 = uVar33 + 1;
                          psVar34 = psVar34 + (uint)req_comp;
                          auVar31 = local_8928;
                        } while (uVar33 < psVar47->img_x);
                      }
                    }
                  }
                  else {
LAB_0015a657:
                    uVar16 = psVar47->img_x;
                    auVar31 = (undefined1  [8])(ulong)uVar16;
                    if (req_comp == 1) {
                      if (uVar16 != 0) {
                        auVar31 = (undefined1  [8])0x0;
                        do {
                          (psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x38))[(long)auVar31]
                               = *(stbi_uc *)((long)local_8928 + (long)auVar31);
                          auVar31 = (undefined1  [8])((long)auVar31 + 1);
                        } while ((ulong)auVar31 < (stbi_uc *)(ulong)psVar47->img_x);
                      }
                    }
                    else if (uVar16 != 0) {
                      auVar31 = (undefined1  [8])0x0;
                      do {
                        psVar23->buffer_start[(long)auVar31 * 2 + (ulong)(sVar15 * iVar44) + -0x38]
                             = *(stbi_uc *)((long)local_8928 + (long)auVar31);
                        psVar23->buffer_start[(long)auVar31 * 2 + (ulong)(sVar15 * iVar44) + -0x37]
                             = 0xff;
                        auVar31 = (undefined1  [8])((long)auVar31 + 1);
                      } while ((ulong)auVar31 < (stbi_uc *)(ulong)psVar47->img_x);
                    }
                  }
                }
                else {
                  psVar47 = psVar18->s;
                  if (psVar47->img_n == 3) {
                    if (bVar51) {
                      if (psVar47->img_x != 0) {
                        psVar34 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x35);
                        uVar33 = 0;
                        do {
                          psVar34[-3] = *(stbi_uc *)((long)local_8928 + uVar33);
                          psVar34[-2] = uStack_8920[uVar33];
                          psVar34[-1] = local_8918[uVar33];
                          *psVar34 = 0xff;
                          uVar33 = uVar33 + 1;
                          psVar34 = psVar34 + (uint)req_comp;
                          auVar31 = (undefined1  [8])local_8918;
                        } while (uVar33 < psVar47->img_x);
                      }
                    }
                    else {
LAB_0015a6cc:
                      (*psVar18->YCbCr_to_RGB_kernel)
                                (psVar23->buffer_start +
                                 ((ulong)(uVar50 * req_comp * sVar15) - 0x38),(stbi_uc *)local_8928,
                                 uStack_8920,local_8918,psVar47->img_x,req_comp);
                      auVar31 = (undefined1  [8])extraout_RDX_14;
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar18->app14_color_transform == 2) {
                      (*psVar18->YCbCr_to_RGB_kernel)
                                (psVar23->buffer_start +
                                 ((ulong)(uVar50 * req_comp * sVar15) - 0x38),(stbi_uc *)local_8928,
                                 uStack_8920,local_8918,psVar47->img_x,req_comp);
                      psVar47 = psVar18->s;
                      auVar31 = (undefined1  [8])extraout_RDX_15;
                      if (psVar47->img_x != 0) {
                        psVar34 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x36);
                        auVar31 = (undefined1  [8])0x0;
                        do {
                          bVar12 = uStack_8910[(long)auVar31];
                          iVar14 = (psVar34[-2] ^ 0xff) * (uint)bVar12;
                          psVar34[-2] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          iVar14 = (psVar34[-1] ^ 0xff) * (uint)bVar12;
                          psVar34[-1] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          iVar14 = (*psVar34 ^ 0xff) * (uint)bVar12;
                          *psVar34 = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          auVar31 = (undefined1  [8])((long)auVar31 + 1);
                          psVar34 = psVar34 + (uint)req_comp;
                        } while ((ulong)auVar31 < (stbi_uc *)(ulong)psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar18->app14_color_transform != 0) goto LAB_0015a6cc;
                      if (psVar47->img_x != 0) {
                        psVar34 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x35);
                        uVar33 = 0;
                        do {
                          bVar12 = uStack_8910[uVar33];
                          iVar14 = (uint)*(byte *)((long)local_8928 + uVar33) * (uint)bVar12;
                          psVar34[-3] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          iVar14 = (uint)uStack_8920[uVar33] * (uint)bVar12;
                          psVar34[-2] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                          psVar34[-1] = (char)(((uint)local_8918[uVar33] * (uint)bVar12 + 0x80 >> 8)
                                               + (uint)local_8918[uVar33] * (uint)bVar12 + 0x80 >> 8
                                              );
                          *psVar34 = 0xff;
                          uVar33 = uVar33 + 1;
                          psVar34 = psVar34 + (uint)req_comp;
                          auVar31 = (undefined1  [8])uStack_8920;
                        } while (uVar33 < psVar47->img_x);
                      }
                    }
                  }
                  else if (psVar47->img_x != 0) {
                    psVar35 = psVar23->buffer_start + ((ulong)(sVar15 * iVar44) - 0x35);
                    psVar34 = (stbi_uc *)0x0;
                    do {
                      sVar11 = *(stbi_uc *)((long)local_8928 + (long)psVar34);
                      psVar35[-1] = sVar11;
                      psVar35[-2] = sVar11;
                      psVar35[-3] = sVar11;
                      *psVar35 = 0xff;
                      psVar34 = psVar34 + 1;
                      auVar31 = (undefined1  [8])(ulong)psVar47->img_x;
                      psVar35 = psVar35 + (uint)req_comp;
                    } while (psVar34 < (ulong)auVar31);
                  }
                }
                iVar14 = SUB84(auVar31,0);
                uVar50 = uVar50 + 1;
                psVar47 = psVar18->s;
                iVar44 = iVar44 + req_comp;
              } while (uVar50 < psVar47->img_y);
            }
            stbi__free_jpeg_components(psVar18,psVar47->img_n,iVar14);
            psVar47 = psVar18->s;
            *local_8900 = psVar47->img_x;
            *local_88f8 = psVar47->img_y;
            if (local_88e8 != (int *)0x0) {
              *local_88e8 = (uint)(2 < psVar47->img_n) * 2 + 1;
            }
            goto LAB_0015a937;
          }
          iVar14 = stbi__process_marker(psVar18,(uint)bVar12);
          uVar50 = extraout_EDX_00;
          if (iVar14 != 0) goto LAB_00159818;
        }
      }
LAB_0015a923:
      stbi__free_jpeg_components(psVar18,psVar18->s->img_n,uVar50);
    }
    else {
      pcVar19 = "bad req_comp";
LAB_00158273:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
    }
LAB_0015a932:
    psVar23 = (stbi__context *)0x0;
LAB_0015a937:
    free(psVar18);
  }
  else {
    iVar14 = stbi__check_png_header(s);
    psVar35 = s->img_buffer_original;
    s->img_buffer = psVar35;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar14 == 0) {
      if (psVar35 < s->img_buffer_original_end) {
LAB_00159a60:
        s->img_buffer = psVar35 + 1;
        if (*psVar35 != 'B') goto LAB_00159c99;
        psVar35 = s->img_buffer;
        if (s->img_buffer_end <= psVar35) {
          if (s->read_from_callbacks == 0) goto LAB_00159c99;
          psVar35 = s->buffer_start;
          iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar14 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar14;
          }
          psVar35 = s->img_buffer;
        }
        s->img_buffer = psVar35 + 1;
        if (*psVar35 != 'M') goto LAB_00159c99;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar50 = stbi__get16le(s);
        iVar14 = stbi__get16le(s);
        uVar50 = iVar14 << 0x10 | uVar50;
        if ((((0x38 < uVar50) || ((0x100010000001000U >> ((ulong)uVar50 & 0x3f) & 1) == 0)) &&
            (uVar50 != 0x7c)) && (uVar50 != 0x6c)) goto LAB_00159c99;
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        uStack_8910._4_4_ = 0xff;
        pvVar21 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8928);
        uVar50 = (uint)uStack_8910;
        if (pvVar21 == (void *)0x0) goto LAB_001582d2;
        local_88b0 = s->img_y;
        sVar15 = -local_88b0;
        if (0 < (int)local_88b0) {
          sVar15 = local_88b0;
        }
        s->img_y = sVar15;
        uVar8 = local_8928._0_4_;
        if ((int)uStack_8920 == 0xc) {
          if ((int)local_8928._0_4_ < 0x18) {
            uVar28 = ((local_8928._4_4_ - local_8908) + -0x18) / 3;
          }
          else {
LAB_00159e62:
            uVar28 = 0;
          }
        }
        else {
          if (0xf < (int)local_8928._0_4_) goto LAB_00159e62;
          uVar28 = local_8928._4_4_ - (local_8908 + (int)uStack_8920) >> 2;
        }
        local_8938 = uStack_8910._4_4_;
        if ((uVar28 == 0) &&
           (s->img_buffer + (-0x38 - (long)s) != (stbi_uc *)(long)(int)local_8928._4_4_)) {
          __assert_fail("info.offset == (s->img_buffer - s->buffer_start)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                        ,0x14de,
                        "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        uVar16 = (uint)uStack_8910 ^ 0xff000000;
        s->img_n = 4 - (uint)((uint)uStack_8910 == 0 || local_8928._0_4_ == 0x18 && uVar16 == 0);
        iVar14 = req_comp;
        if (req_comp < 3) {
          iVar14 = s->img_n;
        }
        sVar4 = s->img_x;
        iVar44 = stbi__mad3sizes_valid(iVar14,sVar4,sVar15,0);
        if (iVar44 == 0) {
          pcVar19 = "too large";
        }
        else {
          data_01 = (uchar *)stbi__malloc_mad3(iVar14,sVar4,sVar15,0);
          if (data_01 != (uchar *)0x0) {
            if ((int)uVar8 < 0x10) {
              if (0x100 < (int)uVar28 || uVar28 == 0) {
                free(data_01);
                pcVar19 = "invalid";
                goto LAB_001582c9;
              }
              if (0 < (int)uVar28) {
                psVar34 = s->buffer_start;
                psVar35 = s->buffer_start + 1;
                uVar33 = 0;
                do {
                  psVar24 = s->img_buffer;
                  if (psVar24 < s->img_buffer_end) {
LAB_0015aaa6:
                    s->img_buffer = psVar24 + 1;
                    sVar11 = *psVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar44 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                      if (iVar44 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar35;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar34 + iVar44;
                      }
                      psVar24 = s->img_buffer;
                      goto LAB_0015aaa6;
                    }
                    sVar11 = '\0';
                  }
                  local_88a8.pal[uVar33 - 0xd][2] = sVar11;
                  psVar24 = s->img_buffer;
                  if (psVar24 < s->img_buffer_end) {
LAB_0015ab25:
                    s->img_buffer = psVar24 + 1;
                    sVar11 = *psVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar44 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                      if (iVar44 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar35;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar34 + iVar44;
                      }
                      psVar24 = s->img_buffer;
                      goto LAB_0015ab25;
                    }
                    sVar11 = '\0';
                  }
                  local_88a8.pal[uVar33 - 0xd][1] = sVar11;
                  psVar24 = s->img_buffer;
                  if (psVar24 < s->img_buffer_end) {
LAB_0015aba4:
                    s->img_buffer = psVar24 + 1;
                    sVar11 = *psVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar44 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                      if (iVar44 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar35;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar34 + iVar44;
                      }
                      psVar24 = s->img_buffer;
                      goto LAB_0015aba4;
                    }
                    sVar11 = '\0';
                  }
                  local_88a8.pal[uVar33 - 0xd][0] = sVar11;
                  if ((int)uStack_8920 != 0xc) {
                    psVar24 = s->img_buffer;
                    if (s->img_buffer_end <= psVar24) {
                      if (s->read_from_callbacks == 0) goto LAB_0015ac30;
                      iVar44 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                      if (iVar44 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar35;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar34;
                        s->img_buffer_end = psVar34 + iVar44;
                      }
                      psVar24 = s->img_buffer;
                    }
                    s->img_buffer = psVar24 + 1;
                  }
LAB_0015ac30:
                  local_88a8.pal[uVar33 - 0xd][3] = 0xff;
                  uVar33 = uVar33 + 1;
                } while (uVar28 != uVar33);
              }
              stbi__skip(s,(uVar28 * ((int)uStack_8920 == 0xc | 0xfffffffc) + local_8928._4_4_) -
                           ((int)uStack_8920 + local_8908));
              if (uVar8 == 8) {
                uVar50 = s->img_x;
              }
              else if (uVar8 == 4) {
                uVar50 = s->img_x + 1 >> 1;
              }
              else {
                if (uVar8 != 1) {
                  free(data_01);
                  pcVar19 = "bad bpp";
                  goto LAB_001582c9;
                }
                uVar50 = s->img_x + 7 >> 3;
              }
              if (uVar8 == 1) {
                if (0 < (int)s->img_y) {
                  local_8990 = -uVar50 & 3;
                  psVar34 = s->buffer_start;
                  iVar44 = 0;
                  iVar43 = 0;
                  do {
                    pbVar26 = s->img_buffer;
                    if (pbVar26 < s->img_buffer_end) {
LAB_0015b4fc:
                      s->img_buffer = pbVar26 + 1;
                      uVar50 = (uint)*pbVar26;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                        if (iVar39 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar34;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar34;
                          s->img_buffer_end = psVar34 + iVar39;
                        }
                        pbVar26 = s->img_buffer;
                        goto LAB_0015b4fc;
                      }
                      uVar50 = 0;
                    }
                    uVar28 = 7;
                    sVar15 = 1;
                    do {
                      sVar4 = s->img_x;
                      if ((int)sVar4 <= (int)(sVar15 - 1)) break;
                      uVar33 = (ulong)((uVar50 >> (uVar28 & 0x1f) & 1) != 0);
                      data_01[iVar44] = local_88a8.pal[uVar33 - 0xd][0];
                      data_01[(long)iVar44 + 1] = local_88a8.pal[uVar33 - 0xd][1];
                      data_01[(long)iVar44 + 2] = local_88a8.pal[uVar33 - 0xd][2];
                      iVar39 = iVar44 + 3;
                      if (iVar14 == 4) {
                        data_01[(long)iVar44 + 3] = 0xff;
                        iVar39 = iVar44 + 4;
                      }
                      iVar44 = iVar39;
                      if (sVar15 != sVar4) {
                        if ((int)uVar28 < 1) {
                          pbVar26 = s->img_buffer;
                          if (pbVar26 < s->img_buffer_end) {
LAB_0015b603:
                            s->img_buffer = pbVar26 + 1;
                            uVar50 = (uint)*pbVar26;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                              if (iVar39 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar34;
                                s->img_buffer_end = s->buffer_start + 1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar34;
                                s->img_buffer_end = psVar34 + iVar39;
                              }
                              pbVar26 = s->img_buffer;
                              goto LAB_0015b603;
                            }
                            uVar50 = 0;
                          }
                          uVar28 = 7;
                        }
                        else {
                          uVar28 = uVar28 - 1;
                        }
                      }
                      bVar51 = sVar15 != sVar4;
                      sVar15 = sVar15 + 1;
                    } while (bVar51);
                    stbi__skip(s,local_8990);
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < (int)s->img_y);
                }
              }
              else if (0 < (int)s->img_y) {
                psVar34 = s->buffer_start;
                uVar33 = 0;
                iVar44 = 0;
                local_8990 = -uVar50 & 3;
                do {
                  if (0 < (int)s->img_x) {
                    iVar43 = 0;
                    do {
                      iVar39 = (int)uVar33;
                      pbVar26 = s->img_buffer;
                      if (pbVar26 < s->img_buffer_end) {
LAB_0015b703:
                        s->img_buffer = pbVar26 + 1;
                        uVar50 = (uint)*pbVar26;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                          if (iVar40 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar34;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar34;
                            s->img_buffer_end = psVar34 + iVar40;
                          }
                          pbVar26 = s->img_buffer;
                          goto LAB_0015b703;
                        }
                        uVar50 = 0;
                      }
                      uVar28 = uVar50 >> 4;
                      if (uVar8 != 4) {
                        uVar28 = uVar50;
                      }
                      uVar33 = (ulong)uVar28;
                      uVar50 = uVar50 & 0xf;
                      if (uVar8 != 4) {
                        uVar50 = 0;
                      }
                      uVar28 = iVar39 + 3;
                      data_01[iVar39] = local_88a8.pal[uVar33 - 0xd][0];
                      data_01[(long)iVar39 + 1] = local_88a8.pal[uVar33 - 0xd][1];
                      data_01[(long)iVar39 + 2] = local_88a8.pal[uVar33 - 0xd][2];
                      if (iVar14 == 4) {
                        uVar28 = iVar39 + 4;
                        data_01[(long)iVar39 + 3] = 0xff;
                      }
                      sVar15 = s->img_x;
                      if (iVar43 + 1U == sVar15) {
LAB_0015b853:
                        uVar33 = (ulong)uVar28;
                      }
                      else {
                        if (uVar8 == 8) {
                          pbVar26 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar26) {
                            if (s->read_from_callbacks == 0) {
                              uVar50 = 0;
                              goto LAB_0015b812;
                            }
                            iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                            if (iVar39 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar34;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar34;
                              s->img_buffer_end = psVar34 + iVar39;
                            }
                            pbVar26 = s->img_buffer;
                          }
                          s->img_buffer = pbVar26 + 1;
                          uVar50 = (uint)*pbVar26;
                        }
LAB_0015b812:
                        lVar20 = (long)(int)uVar28;
                        uVar33 = lVar20 + 3;
                        uVar32 = (ulong)uVar50;
                        data_01[lVar20] = local_88a8.pal[uVar32 - 0xd][0];
                        data_01[lVar20 + 1] = local_88a8.pal[uVar32 - 0xd][1];
                        data_01[lVar20 + 2] = local_88a8.pal[uVar32 - 0xd][2];
                        if (iVar14 == 4) {
                          uVar28 = uVar28 + 4;
                          data_01[lVar20 + 3] = 0xff;
                          goto LAB_0015b853;
                        }
                      }
                    } while ((iVar43 + 1U != sVar15) &&
                            (iVar43 = iVar43 + 2, iVar43 < (int)s->img_x));
                  }
                  stbi__skip(s,local_8990);
                  iVar44 = iVar44 + 1;
                } while (iVar44 < (int)s->img_y);
              }
            }
            else {
              uVar28 = local_8928._4_4_ - ((int)uStack_8920 + local_8908);
              uVar33 = (ulong)uVar28;
              stbi__skip(s,uVar28);
              if (uVar8 == 0x18) {
                iVar44 = -3;
LAB_0015acf1:
                uVar28 = iVar44 * s->img_x & 3;
              }
              else {
                uVar28 = 0;
                if (uVar8 == 0x10) {
                  iVar44 = -2;
                  goto LAB_0015acf1;
                }
              }
              iVar44 = 0;
              if (uVar8 == 0x18) {
                uVar33 = 0;
LAB_0015ad42:
                local_88d8 = (int *)((ulong)local_88d8._4_4_ << 0x20);
              }
              else {
                uVar37 = (undefined7)(uVar33 >> 8);
                if (uVar8 != 0x20) {
                  uVar33 = CONCAT71(uVar37,1);
                  goto LAB_0015ad42;
                }
                uVar16 = uStack_8920._4_4_ ^ 0xff0000 |
                         (uint)local_8918 ^ 0xff00 | local_8918._4_4_ ^ 0xff | uVar16;
                local_88d8 = (int *)CONCAT44(local_88d8._4_4_,
                                             CONCAT31((int3)(uVar16 >> 8),uVar16 == 0));
                uVar33 = CONCAT71(uVar37,uVar16 != 0);
              }
              iVar43 = 0;
              local_892c = 0;
              local_88b8 = local_88b8 & 0xffffffff00000000;
              uVar16 = 0;
              local_894c = 0;
              local_88d0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d0 & 0xffffffff00000000);
              local_88ec = 0;
              local_88c4 = (uint)uVar33;
              if ((char)uVar33 == '\0') {
LAB_0015af45:
                bVar51 = true;
                if (0 < (int)s->img_y) {
                  psVar34 = s->buffer_start;
                  local_88c0 = s->buffer_start + 1;
                  iVar40 = 0;
                  iVar39 = 0;
                  local_88dc = uVar28;
                  do {
                    local_88ac = iVar39;
                    if ((char)uVar33 == '\0') {
                      if (0 < (int)s->img_x) {
                        iVar39 = 0;
                        do {
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015b0e7:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                              if (iVar49 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar34;
                                s->img_buffer_end = local_88c0;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar34;
                                s->img_buffer_end = psVar34 + iVar49;
                              }
                              puVar25 = s->img_buffer;
                              goto LAB_0015b0e7;
                            }
                            uVar13 = '\0';
                          }
                          data_01[(long)iVar40 + 2] = uVar13;
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015b173:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                              if (iVar49 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar34;
                                s->img_buffer_end = local_88c0;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar34;
                                s->img_buffer_end = psVar34 + iVar49;
                              }
                              puVar25 = s->img_buffer;
                              goto LAB_0015b173;
                            }
                            uVar13 = '\0';
                          }
                          data_01[(long)iVar40 + 1] = uVar13;
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015b1fc:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                              if (iVar49 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar34;
                                s->img_buffer_end = local_88c0;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar34;
                                s->img_buffer_end = psVar34 + iVar49;
                              }
                              puVar25 = s->img_buffer;
                              goto LAB_0015b1fc;
                            }
                            uVar13 = '\0';
                          }
                          data_01[iVar40] = uVar13;
                          bVar12 = 0xff;
                          if ((char)local_88d8 != '\0') {
                            pbVar26 = s->img_buffer;
                            if (s->img_buffer_end <= pbVar26) {
                              if (s->read_from_callbacks == 0) {
                                bVar12 = 0;
                                goto LAB_0015b2a2;
                              }
                              iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
                              if (iVar49 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar34;
                                s->img_buffer_end = local_88c0;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar34;
                                s->img_buffer_end = psVar34 + iVar49;
                              }
                              pbVar26 = s->img_buffer;
                            }
                            s->img_buffer = pbVar26 + 1;
                            bVar12 = *pbVar26;
                          }
LAB_0015b2a2:
                          iVar49 = iVar40 + 3;
                          if (iVar14 == 4) {
                            data_01[(long)iVar40 + 3] = bVar12;
                            iVar49 = iVar40 + 4;
                          }
                          iVar40 = iVar49;
                          local_8938 = local_8938 | bVar12;
                          iVar39 = iVar39 + 1;
                        } while (iVar39 < (int)s->img_x);
                      }
                    }
                    else if (0 < (int)s->img_x) {
                      iVar39 = 0;
                      do {
                        uVar28 = stbi__get16le(s);
                        if (uVar8 != 0x10) {
                          iVar49 = stbi__get16le(s);
                          uVar28 = uVar28 | iVar49 << 0x10;
                        }
                        iVar49 = stbi__shiftsigned(uVar28 & uStack_8920._4_4_,iVar44,uVar16);
                        data_01[iVar40] = (uchar)iVar49;
                        iVar49 = stbi__shiftsigned(uVar28 & (uint)local_8918,iVar43,local_894c);
                        data_01[(long)iVar40 + 1] = (uchar)iVar49;
                        iVar49 = stbi__shiftsigned(uVar28 & local_8918._4_4_,local_892c,
                                                   (int)local_88d0);
                        data_01[(long)iVar40 + 2] = (uchar)iVar49;
                        if (uVar50 == 0) {
                          uVar28 = 0xff;
                        }
                        else {
                          uVar28 = stbi__shiftsigned(uVar28 & uVar50,(int)local_88b8,local_88ec);
                        }
                        iVar49 = iVar40 + 3;
                        if (iVar14 == 4) {
                          data_01[(long)iVar40 + 3] = (uchar)uVar28;
                          iVar49 = iVar40 + 4;
                        }
                        iVar40 = iVar49;
                        local_8938 = local_8938 | uVar28;
                        iVar39 = iVar39 + 1;
                      } while (iVar39 < (int)s->img_x);
                    }
                    stbi__skip(s,local_88dc);
                    iVar39 = local_88ac + 1;
                    uVar33 = (ulong)local_88c4;
                  } while (iVar39 < (int)s->img_y);
                  bVar51 = true;
                }
              }
              else {
                if (((uint)local_8918 != 0 && uStack_8920._4_4_ != 0) && local_8918._4_4_ != 0) {
                  local_88dc = uVar28;
                  iVar44 = stbi__high_bit(uStack_8920._4_4_);
                  iVar44 = iVar44 + -7;
                  uVar28 = (uStack_8920._4_4_ >> 1 & 0x55555555) + (uStack_8920._4_4_ & 0x55555555);
                  uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                  uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                  uVar28 = (uVar28 >> 8) + uVar28;
                  uVar16 = (uVar28 >> 0x10) + uVar28 & 0xff;
                  iVar43 = stbi__high_bit((uint)local_8918);
                  iVar43 = iVar43 + -7;
                  uVar28 = ((uint)local_8918 >> 1 & 0x55555555) + ((uint)local_8918 & 0x55555555);
                  uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                  uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                  uVar28 = (uVar28 >> 8) + uVar28;
                  local_894c = (uVar28 >> 0x10) + uVar28 & 0xff;
                  local_892c = stbi__high_bit(local_8918._4_4_);
                  local_892c = local_892c + -7;
                  uVar28 = (local_8918._4_4_ >> 1 & 0x55555555) + (local_8918._4_4_ & 0x55555555);
                  uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                  uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                  uVar28 = (uVar28 >> 8) + uVar28;
                  local_88d0 = (anon_struct_96_18_0d0905d3 *)
                               (CONCAT44(local_88d0._4_4_,(uVar28 >> 0x10) + uVar28) &
                               0xffffffff000000ff);
                  iVar39 = stbi__high_bit(uVar50);
                  uVar33 = (ulong)local_88c4;
                  local_88b8 = CONCAT44(local_88b8._4_4_,iVar39 + -7);
                  uVar28 = (uVar50 >> 1 & 0x55555555) + (uVar50 & 0x55555555);
                  uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                  uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                  uVar28 = (uVar28 >> 8) + uVar28;
                  local_88ec = (uVar28 >> 0x10) + uVar28 & 0xff;
                  uVar28 = local_88dc;
                  goto LAB_0015af45;
                }
                free(data_01);
                *(char **)(in_FS_OFFSET + -0x10) = "bad masks";
                bVar51 = false;
              }
              if (!bVar51) goto LAB_001582d2;
            }
            if (((iVar14 == 4) && (local_8938 == 0)) &&
               (iVar44 = s->img_x * s->img_y * 4, -1 < iVar44 + -1)) {
              lVar20 = (ulong)(iVar44 - 4) + 7;
              do {
                data_01[lVar20 + -4] = 0xff;
                lVar20 = lVar20 + -4;
              } while (3 < lVar20);
            }
            if (0 < (int)local_88b0) {
              uVar50 = (int)s->img_y >> 1;
              if (0 < (int)uVar50) {
                uVar16 = s->img_x * iVar14;
                uVar28 = (s->img_y - 1) * uVar16;
                uVar33 = 0;
                uVar32 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar42 = 0;
                    do {
                      uVar13 = data_01[uVar42 + uVar33];
                      data_01[uVar42 + uVar33] = data_01[uVar42 + uVar28];
                      data_01[uVar42 + uVar28] = uVar13;
                      uVar42 = uVar42 + 1;
                    } while (uVar16 != uVar42);
                  }
                  uVar32 = uVar32 + 1;
                  uVar28 = uVar28 - uVar16;
                  uVar33 = (ulong)((int)uVar33 + uVar16);
                } while (uVar32 != uVar50);
              }
            }
            if ((iVar14 == req_comp || req_comp == 0) ||
               (data_01 = stbi__convert_format(data_01,iVar14,req_comp,s->img_x,s->img_y),
               data_01 != (uchar *)0x0)) {
              *local_8900 = s->img_x;
              *local_88f8 = s->img_y;
              if (local_88e8 == (int *)0x0) {
                return data_01;
              }
              *local_88e8 = s->img_n;
              return data_01;
            }
            goto LAB_001582d2;
          }
          pcVar19 = "outofmem";
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          psVar35 = s->buffer_start;
          iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
          if (iVar14 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar35;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar35;
            s->img_buffer_end = psVar35 + iVar14;
          }
          psVar35 = s->img_buffer;
          goto LAB_00159a60;
        }
LAB_00159c99:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        iVar14 = stbi__gif_test(s);
        if (iVar14 != 0) {
          memset(&local_88a8,0,0x8870);
          psVar23 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88e8,0,psVar34);
          if (psVar23 == s) {
            psVar23 = (stbi__context *)0x0;
          }
          if (psVar23 == (stbi__context *)0x0) {
            if (local_88a8.out != (stbi_uc *)0x0) {
              free(local_88a8.out);
            }
            psVar23 = (stbi__context *)0x0;
          }
          else {
            *local_8900 = local_88a8.w;
            *local_88f8 = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              psVar23 = (stbi__context *)
                        stbi__convert_format((uchar *)psVar23,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          psVar18 = (stbi__jpeg *)local_88a8.background;
          goto LAB_0015a937;
        }
        iVar14 = stbi__psd_test(s);
        if (iVar14 != 0) {
          pvVar21 = stbi__psd_load(s,(int *)local_8900,(int *)local_88f8,local_88e8,req_comp,ri,bpc)
          ;
          return pvVar21;
        }
        iVar14 = stbi__pic_test(s);
        piVar46 = local_88e8;
        if (iVar14 != 0) {
          pvVar21 = stbi__pic_load(s,(int *)local_8900,(int *)local_88f8,local_88e8,req_comp,ri_00);
          return pvVar21;
        }
        iVar14 = stbi__pnm_test(s);
        if (iVar14 != 0) {
          pvVar21 = stbi__pnm_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
          return pvVar21;
        }
        iVar14 = stbi__hdr_test(s);
        psVar10 = local_88f8;
        psVar9 = local_8900;
        if (iVar14 != 0) {
          data_02 = stbi__hdr_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *piVar46;
          }
          psVar34 = stbi__hdr_to_ldr(data_02,*psVar9,*psVar10,req_comp);
          return psVar34;
        }
        iVar14 = stbi__tga_test(s);
        if (iVar14 != 0) {
          pvVar21 = stbi__tga_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
          return pvVar21;
        }
        pcVar19 = "unknown image type";
      }
LAB_001582c9:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar19 = "bad req_comp";
        goto LAB_001582c9;
      }
      local_88a8._0_8_ = s;
      iVar14 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      data_00 = (stbi__uint16 *)local_88a8.history;
      uVar7 = local_88a8._0_8_;
      if (iVar14 == 0) {
        data_00 = (stbi__uint16 *)0x0;
        goto LAB_00159b0d;
      }
      iVar14 = 8;
      if (8 < local_88a8.flags) {
        iVar14 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar14;
      local_88a8.history = (stbi_uc *)0x0;
      if ((req_comp == 0) || (iVar14 = *(int *)(local_88a8._0_8_ + 0xc), iVar14 == req_comp)) {
LAB_00159ada:
        *local_8900 = *(stbi__uint32 *)local_88a8._0_8_;
        *local_88f8 = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        if (local_88e8 != (int *)0x0) {
          *local_88e8 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_00159b0d:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return data_00;
      }
      if (local_88a8.flags < 9) {
        data_00 = (stbi__uint16 *)
                  stbi__convert_format
                            ((uchar *)data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        data_00 = stbi__convert_format16
                            (data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (data_00 != (stbi__uint16 *)0x0) goto LAB_00159ada;
    }
LAB_001582d2:
    psVar23 = (stbi__context *)0x0;
  }
  return psVar23;
LAB_001597ee:
  iVar14 = 0;
LAB_00159806:
  if (iVar14 == 0) goto LAB_0015a923;
  if (psVar18->marker != 0xff) goto LAB_00159818;
LAB_00159825:
  do {
    psVar23 = psVar18->s;
    if ((psVar23->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00159841:
      if (psVar23->img_buffer_end <= psVar23->img_buffer) goto LAB_00159818;
    }
    else {
      iVar14 = (*(psVar23->io).eof)(psVar23->io_user_data);
      if (iVar14 != 0) {
        if (psVar23->read_from_callbacks != 0) goto LAB_00159841;
        goto LAB_00159818;
      }
    }
    psVar23 = psVar18->s;
    psVar34 = psVar23->img_buffer;
    if (psVar23->img_buffer_end <= psVar34) {
      if (psVar23->read_from_callbacks == 0) goto LAB_00159825;
      psVar34 = psVar23->buffer_start;
      iVar14 = (*(psVar23->io).read)(psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
      if (iVar14 == 0) {
        psVar23->read_from_callbacks = 0;
        psVar23->img_buffer = psVar34;
        psVar23->img_buffer_end = psVar23->buffer_start + 1;
        psVar23->buffer_start[0] = '\0';
      }
      else {
        psVar23->img_buffer = psVar34;
        psVar23->img_buffer_end = psVar34 + iVar14;
      }
      psVar34 = psVar23->img_buffer;
    }
    psVar23->img_buffer = psVar34 + 1;
  } while (*psVar34 != 0xff);
  psVar23 = psVar18->s;
  psVar34 = psVar23->img_buffer;
  if (psVar34 < psVar23->img_buffer_end) {
LAB_00159943:
    psVar23->img_buffer = psVar34 + 1;
    sVar11 = *psVar34;
  }
  else {
    if (psVar23->read_from_callbacks != 0) {
      psVar34 = psVar23->buffer_start;
      iVar14 = (*(psVar23->io).read)(psVar23->io_user_data,(char *)psVar34,psVar23->buflen);
      if (iVar14 == 0) {
        psVar23->read_from_callbacks = 0;
        psVar23->img_buffer = psVar34;
        psVar23->img_buffer_end = psVar23->buffer_start + 1;
        psVar23->buffer_start[0] = '\0';
      }
      else {
        psVar23->img_buffer = psVar34;
        psVar23->img_buffer_end = psVar34 + iVar14;
      }
      psVar34 = psVar23->img_buffer;
      goto LAB_00159943;
    }
    sVar11 = '\0';
  }
  psVar18->marker = sVar11;
LAB_00159818:
  bVar12 = stbi__get_marker(psVar18);
  goto LAB_00158365;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

#ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
#else
   STBI_NOTUSED(bpc);
#endif
#ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
#endif
#ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
#endif

#ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
#endif

#ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
#endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}